

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall nivalis::ParseSession::begin_thunk(ParseSession *this)

{
  _OpCode local_14;
  unsigned_long local_10;
  
  local_10 = (long)(this->result).ast.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->result).ast.
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->thunks,&local_10);
  local_14 = thunk_ret;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
  emplace_back<nivalis::OpCode::_OpCode>(&(this->result).ast,&local_14);
  return;
}

Assistant:

void begin_thunk() {
        thunks.push_back(result.ast.size());
        result.ast.emplace_back(OpCode::thunk_ret);
    }